

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseUninterpretedBlock(Parser *this,string *value)

{
  ErrorCollector *pEVar1;
  bool bVar2;
  int iVar3;
  Tokenizer *pTVar4;
  int iVar5;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  bVar2 = Consume(this,"{");
  if (bVar2) {
    pTVar4 = this->input_;
    bVar2 = (pTVar4->current_).type != TYPE_END;
    if (bVar2) {
      iVar5 = 1;
      do {
        iVar3 = std::__cxx11::string::compare((char *)&(pTVar4->current_).text);
        if (iVar3 == 0) {
          iVar5 = iVar5 + 1;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
          if ((iVar3 == 0) && (iVar5 = iVar5 + -1, iVar5 == 0)) {
            io::Tokenizer::Next(this->input_);
            return bVar2;
          }
        }
        if (value->_M_string_length != 0) {
          std::__cxx11::string::push_back((char)value);
        }
        std::__cxx11::string::_M_append
                  ((char *)value,(ulong)(this->input_->current_).text._M_dataplus._M_p);
        io::Tokenizer::Next(this->input_);
        pTVar4 = this->input_;
        bVar2 = (pTVar4->current_).type != TYPE_END;
      } while (bVar2);
    }
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Unexpected end of stream while parsing aggregate value.","");
    pEVar1 = this->error_collector_;
    if (pEVar1 != (ErrorCollector *)0x0) {
      (*pEVar1->_vptr_ErrorCollector[2])
                (pEVar1,(ulong)(uint)(this->input_->current_).line,
                 (ulong)(uint)(this->input_->current_).column,local_50);
    }
    this->had_errors_ = true;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Parser::ParseUninterpretedBlock(std::string* value) {
  // Note that enclosing braces are not added to *value.
  // We do NOT use ConsumeEndOfStatement for this brace because it's delimiting
  // an expression, not a block of statements.
  DO(Consume("{"));
  int brace_depth = 1;
  while (!AtEnd()) {
    if (LookingAt("{")) {
      brace_depth++;
    } else if (LookingAt("}")) {
      brace_depth--;
      if (brace_depth == 0) {
        input_->Next();
        return true;
      }
    }
    // TODO(sanjay): Interpret line/column numbers to preserve formatting
    if (!value->empty()) value->push_back(' ');
    value->append(input_->current().text);
    input_->Next();
  }
  AddError("Unexpected end of stream while parsing aggregate value.");
  return false;
}